

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::VerifyConstantBufferBinding<Diligent::BufferVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,BufferVkImpl *pBufferImpl,
               IDeviceObject *pCachedBuffer,Uint64 CachedBaseOffset,Uint64 CachedRangeSize,
               char *SignatureName)

{
  bool bVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  BIND_FLAGS BVar3;
  ostream *poVar4;
  Char *pCVar5;
  RenderDeviceVkImpl *this;
  GraphicsAdapterInfo *pGVar6;
  BufferDesc *Args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_01;
  BufferDesc *in_stack_fffffffffffff838;
  char (*in_stack_fffffffffffff858) [30];
  undefined1 local_6b0 [8];
  string msg_6;
  undefined1 local_670 [8];
  string msg_5;
  stringstream local_630 [8];
  stringstream ss_2;
  ostream local_620 [376];
  Char *local_4a8;
  Uint64 NewBufferRangeSize;
  string msg_4;
  string msg_3;
  Char *pCStack_458;
  Uint32 OffsetAlignment;
  undefined1 local_450 [8];
  string msg_2;
  Diligent local_428 [7];
  bool RangeIsOutOfBounds;
  undefined1 local_408 [8];
  string msg_1;
  stringstream local_3c8 [8];
  stringstream ss_1;
  ostream local_3b8 [376];
  Diligent local_240 [32];
  undefined1 local_220 [8];
  string msg;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  BufferDesc *local_48;
  BufferDesc *BuffDesc;
  Char *pCStack_38;
  bool BindingOK;
  Uint64 CachedRangeSize_local;
  Uint64 CachedBaseOffset_local;
  IDeviceObject *pCachedBuffer_local;
  BufferVkImpl *pBufferImpl_local;
  BindResourceInfo *BindInfo_local;
  PipelineResourceDesc *ResDesc_local;
  
  pCStack_38 = (Char *)CachedRangeSize;
  CachedRangeSize_local = CachedBaseOffset;
  CachedBaseOffset_local = (Uint64)pCachedBuffer;
  pCachedBuffer_local = (IDeviceObject *)pBufferImpl;
  pBufferImpl_local = (BufferVkImpl *)BindInfo;
  BindInfo_local = (BindResourceInfo *)ResDesc;
  BuffDesc._7_1_ =
       VerifyResourceBinding<Diligent::BufferVkImpl>
                 ("buffer",ResDesc,BindInfo,pBufferImpl,pCachedBuffer,SignatureName);
  if (pCachedBuffer_local == (IDeviceObject *)0x0) {
    if (((pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_pDevice != (RenderDeviceVkImpl *)0x0) ||
       ((pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.super_DeviceObjectAttribs.Name != (Char *)0x0)) {
      FormatString<char[55]>
                ((string *)local_6b0,
                 (char (*) [55])"Non-empty buffer range is specified for a null buffer.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x139);
      std::__cxx11::string::~string((string *)local_6b0);
    }
  }
  else {
    local_48 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)pCachedBuffer_local);
    BVar3 = operator&(local_48->BindFlags,BIND_UNIFORM_BUFFER);
    if (BVar3 == BIND_NONE) {
      std::__cxx11::stringstream::stringstream(local_1d0);
      poVar4 = std::operator<<(local_1c0,"Error binding buffer \'");
      poVar4 = std::operator<<(poVar4,(local_48->super_DeviceObjectAttribs).Name);
      poVar4 = std::operator<<(poVar4,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                ((String *)((long)&msg.field_2 + 8),(PipelineResourceDesc *)BindInfo_local,
                 *(Uint32 *)
                  ((long)&(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          .super_ObjectBase<Diligent::IBufferVk>.
                          super_RefCountedObject<Diligent::IBufferVk>.m_pRefCounters + 4));
      poVar4 = std::operator<<(poVar4,(string *)(msg.field_2._M_local_buf + 8));
      std::operator<<(poVar4,'\'');
      std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
      if (SignatureName != (char *)0x0) {
        poVar4 = std::operator<<(local_1c0," defined by signature \'");
        poVar4 = std::operator<<(poVar4,SignatureName);
        std::operator<<(poVar4,'\'');
      }
      std::operator<<(local_1c0,". The buffer was not created with BIND_UNIFORM_BUFFER flag.");
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>((string *)local_220,local_240,Args);
      std::__cxx11::string::~string((string *)local_240);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0xf8);
      std::__cxx11::string::~string((string *)local_220);
      BuffDesc._7_1_ = 0;
      std::__cxx11::stringstream::~stringstream(local_1d0);
    }
    if ((local_48->Usage == USAGE_DYNAMIC) &&
       (PVar2 = operator&(*(PIPELINE_RESOURCE_FLAGS *)((long)&BindInfo_local->BufferBaseOffset + 2),
                          PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS),
       PVar2 != PIPELINE_RESOURCE_FLAG_NONE)) {
      std::__cxx11::stringstream::stringstream(local_3c8);
      poVar4 = std::operator<<(local_3b8,"Error binding USAGE_DYNAMIC buffer \'");
      poVar4 = std::operator<<(poVar4,(local_48->super_DeviceObjectAttribs).Name);
      poVar4 = std::operator<<(poVar4,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                ((String *)((long)&msg_1.field_2 + 8),(PipelineResourceDesc *)BindInfo_local,
                 *(Uint32 *)
                  ((long)&(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          .super_ObjectBase<Diligent::IBufferVk>.
                          super_RefCountedObject<Diligent::IBufferVk>.m_pRefCounters + 4));
      poVar4 = std::operator<<(poVar4,(string *)(msg_1.field_2._M_local_buf + 8));
      std::operator<<(poVar4,'\'');
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      if (SignatureName != (char *)0x0) {
        poVar4 = std::operator<<(local_3b8," defined by signature \'");
        poVar4 = std::operator<<(poVar4,SignatureName);
        std::operator<<(poVar4,'\'');
      }
      std::operator<<(local_3b8,
                      ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
                     );
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>((string *)local_408,local_428,Args_00);
      std::__cxx11::string::~string((string *)local_428);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x106);
      std::__cxx11::string::~string((string *)local_408);
      BuffDesc._7_1_ = 0;
      std::__cxx11::stringstream::~stringstream(local_3c8);
    }
    msg_2.field_2._M_local_buf[0xf] = '\0';
    bVar1 = (Char *)local_48->Size <
            (pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.super_DeviceObjectAttribs.Name +
            (long)&(((pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_pDevice)->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
    Args_1 = local_48;
    if (bVar1) {
      pCStack_458 = (pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_Desc.super_DeviceObjectAttribs.Name +
                    (long)&(((pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            .m_pDevice)->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
      in_stack_fffffffffffff838 = local_48;
      FormatString<char[15],unsigned_long,char[3],unsigned_long,char[25],char_const*,char[11],unsigned_long,char[30]>
                ((string *)local_450,(Diligent *)"Buffer range [",
                 (char (*) [15])
                 &(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_pDevice,(unsigned_long *)0xd26306,(char (*) [3])&stack0xfffffffffffffba8,
                 (unsigned_long *)") specified for buffer \'",(char (*) [25])local_48,
                 (char **)"\' of size ",(char (*) [11])&local_48->Size,
                 (unsigned_long *)" is out of the buffer bounds.",in_stack_fffffffffffff858);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (BufferDesc *)0x10f;
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x10f);
      std::__cxx11::string::~string((string *)local_450);
      BuffDesc._7_1_ = 0;
    }
    msg_2.field_2._M_local_buf[0xf] = bVar1;
    this = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)pCachedBuffer_local);
    pGVar6 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this);
    msg_3.field_2._12_4_ = (pGVar6->Buffer).ConstantBufferOffsetAlignment;
    if (msg_3.field_2._12_4_ == 0) {
      FormatString<char[26],char[21]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])0xcc0fe6,(char (*) [21])Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x115);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if ((ulong)(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_pDevice % (ulong)(uint)msg_3.field_2._12_4_ != 0) {
      FormatString<char[21],unsigned_long,char[67],unsigned_int,char[3]>
                ((string *)&NewBufferRangeSize,(Diligent *)"Buffer base offset (",
                 (char (*) [21])
                 &(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_pDevice,
                 (unsigned_long *)
                 ") is not a multiple of required constant buffer offset alignment (",
                 (char (*) [67])((long)&msg_3.field_2 + 0xc),(uint *)0xccce78,
                 (char (*) [3])in_stack_fffffffffffff838);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x119);
      std::__cxx11::string::~string((string *)&NewBufferRangeSize);
      BuffDesc._7_1_ = 0;
    }
    if ((((msg_2.field_2._M_local_buf[0xf] & 1U) == 0) &&
        (*(char *)((long)&BindInfo_local->BufferBaseOffset + 1) != '\x02')) &&
       (CachedBaseOffset_local != 0)) {
      if (pCStack_38 == (Char *)0x0) {
        pCStack_38 = (Char *)(local_48->Size - CachedRangeSize_local);
      }
      local_4a8 = (pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc.super_DeviceObjectAttribs.Name;
      if (local_4a8 == (Char *)0x0) {
        local_4a8 = (Char *)(local_48->Size -
                            (long)(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>
                                  ).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_pDevice);
      }
      if (((RenderDeviceVkImpl *)CachedRangeSize_local !=
           (pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_pDevice) || (pCStack_38 != local_4a8)) {
        std::__cxx11::stringstream::stringstream(local_630);
        poVar4 = std::operator<<(local_620,"Error binding buffer \'");
        poVar4 = std::operator<<(poVar4,(local_48->super_DeviceObjectAttribs).Name);
        poVar4 = std::operator<<(poVar4,"\' to variable \'");
        GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                  ((String *)((long)&msg_5.field_2 + 8),(PipelineResourceDesc *)BindInfo_local,
                   *(Uint32 *)
                    ((long)&(pBufferImpl_local->super_BufferBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            .super_ObjectBase<Diligent::IBufferVk>.
                            super_RefCountedObject<Diligent::IBufferVk>.m_pRefCounters + 4));
        poVar4 = std::operator<<(poVar4,(string *)(msg_5.field_2._M_local_buf + 8));
        std::operator<<(poVar4,'\'');
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
        if (SignatureName != (char *)0x0) {
          poVar4 = std::operator<<(local_620," defined by signature \'");
          poVar4 = std::operator<<(poVar4,SignatureName);
          std::operator<<(poVar4,'\'');
        }
        poVar4 = std::operator<<(local_620,". The new range [");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(ulong)(pBufferImpl_local->
                                          super_BufferBase<Diligent::EngineVkImplTraits>).
                                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                          .m_pDevice);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(ulong)(local_4a8 +
                                          (long)&(((pBufferImpl_local->
                                                   super_BufferBase<Diligent::EngineVkImplTraits>).
                                                                                                      
                                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                                  .m_pDevice)->
                                                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                                 ).
                                                 super_RenderDeviceBase<Diligent::EngineVkImplTraits>
                                          ));
        poVar4 = std::operator<<(poVar4,") does not match current range [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,CachedRangeSize_local);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,(ulong)(pCStack_38 + CachedRangeSize_local));
        std::operator<<(poVar4,
                        "). This is treated as binding a new resource even if the buffer itself stays the same. Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset."
                       );
        std::__cxx11::stringstream::str();
        FormatString<std::__cxx11::string>
                  ((string *)local_670,(Diligent *)(msg_6.field_2._M_local_buf + 8),Args_01);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"VerifyConstantBufferBinding",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x132);
        std::__cxx11::string::~string((string *)local_670);
        std::__cxx11::stringstream::~stringstream(local_630);
      }
    }
  }
  return (bool)(BuffDesc._7_1_ & 1);
}

Assistant:

bool VerifyConstantBufferBinding(const PipelineResourceDesc& ResDesc,
                                 const BindResourceInfo&     BindInfo,
                                 const BufferImplType*       pBufferImpl,
                                 const IDeviceObject*        pCachedBuffer,
                                 Uint64                      CachedBaseOffset,
                                 Uint64                      CachedRangeSize,
                                 const char*                 SignatureName)
{
    bool BindingOK = VerifyResourceBinding("buffer", ResDesc, BindInfo, pBufferImpl, pCachedBuffer, SignatureName);

    if (pBufferImpl != nullptr)
    {
        const BufferDesc& BuffDesc = pBufferImpl->GetDesc();
        if ((BuffDesc.BindFlags & BIND_UNIFORM_BUFFER) == 0)
        {
            std::stringstream ss;
            ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The buffer was not created with BIND_UNIFORM_BUFFER flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (BuffDesc.Usage == USAGE_DYNAMIC && (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != 0)
        {
            std::stringstream ss;
            ss << "Error binding USAGE_DYNAMIC buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        bool RangeIsOutOfBounds = false;
        if (BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize > BuffDesc.Size)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer range [", BindInfo.BufferBaseOffset, ", ", BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize,
                                        ") specified for buffer '", BuffDesc.Name, "' of size ", BuffDesc.Size, " is out of the buffer bounds.");
            BindingOK          = false;
            RangeIsOutOfBounds = true;
        }

        const Uint32 OffsetAlignment = pBufferImpl->GetDevice()->GetAdapterInfo().Buffer.ConstantBufferOffsetAlignment;
        VERIFY_EXPR(OffsetAlignment != 0);
        if ((BindInfo.BufferBaseOffset % OffsetAlignment) != 0)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer base offset (", BindInfo.BufferBaseOffset, ") is not a multiple of required constant buffer offset alignment (",
                                        OffsetAlignment, ").");
            BindingOK = false;
        }

        if (!RangeIsOutOfBounds && ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC && pCachedBuffer != nullptr)
        {
            if (CachedRangeSize == 0)
                CachedRangeSize = BuffDesc.Size - CachedBaseOffset;
            Uint64 NewBufferRangeSize = BindInfo.BufferRangeSize;
            if (NewBufferRangeSize == 0)
                NewBufferRangeSize = BuffDesc.Size - BindInfo.BufferBaseOffset;

            if (CachedBaseOffset != BindInfo.BufferBaseOffset ||
                CachedRangeSize != NewBufferRangeSize)
            {
                std::stringstream ss;
                ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
                if (SignatureName != nullptr)
                {
                    ss << " defined by signature '" << SignatureName << '\'';
                }
                ss << ". The new range [" << BindInfo.BufferBaseOffset << ", " << BindInfo.BufferBaseOffset + NewBufferRangeSize
                   << ") does not match current range [" << CachedBaseOffset << ", " << CachedBaseOffset + CachedRangeSize
                   << "). This is treated as binding a new resource even if the buffer itself stays the same. "
                      "Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset.";
                RESOURCE_VALIDATION_FAILURE(ss.str());
            }
        }
    }
    else
    {
        if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
            RESOURCE_VALIDATION_FAILURE("Non-empty buffer range is specified for a null buffer.");
    }

    return BindingOK;
}